

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix4x4.cpp
# Opt level: O2

Matrix4x4 * CMU462::Matrix4x4::scaling(Matrix4x4 *__return_storage_ptr__,Vector3D *s)

{
  identity();
  __return_storage_ptr__->entries[0].x = s->x;
  __return_storage_ptr__->entries[1].y = s->y;
  __return_storage_ptr__->entries[2].z = s->z;
  return __return_storage_ptr__;
}

Assistant:

Matrix4x4 Matrix4x4::scaling(Vector3D s) {
    Matrix4x4 B = Matrix4x4::identity();
    B(0, 0) = s.x;
    B(1, 1) = s.y;
    B(2, 2) = s.z;

    return B;
  }